

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

void Ssc_GiaSimProcessRefined(Gia_Man_t *p,Vec_Int_t *vRefined)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  int local_2c;
  int Key;
  int k;
  int i;
  int nTableSize;
  int *pTable;
  Vec_Int_t *vRefined_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vRefined);
  if (iVar1 != 0) {
    iVar1 = Vec_IntSize(vRefined);
    iVar1 = Abc_PrimeCudd(iVar1 / 3 + 100);
    __ptr = calloc((long)iVar1,4);
    for (local_2c = 0; iVar2 = Vec_IntSize(vRefined), local_2c < iVar2; local_2c = local_2c + 1) {
      iVar2 = Vec_IntEntry(vRefined,local_2c);
      iVar3 = Ssc_GiaSimIsConst0(p,iVar2);
      if (iVar3 != 0) {
        __assert_fail("!Ssc_GiaSimIsConst0( p, i )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                      ,0xe6,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
      }
      iVar3 = Ssc_GiaSimHashKey(p,iVar2,iVar1);
      if (*(int *)((long)__ptr + (long)iVar3 * 4) == 0) {
        iVar4 = Gia_ObjRepr(p,iVar2);
        if (iVar4 != 0) {
          __assert_fail("Gia_ObjRepr(p, i) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                        ,0xea,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
        }
        iVar4 = Gia_ObjNext(p,iVar2);
        if (iVar4 != 0) {
          __assert_fail("Gia_ObjNext(p, i) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                        ,0xeb,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
        }
        Gia_ObjSetRepr(p,iVar2,0xfffffff);
      }
      else {
        Gia_ObjSetNext(p,*(int *)((long)__ptr + (long)iVar3 * 4),iVar2);
        iVar4 = Gia_ObjRepr(p,*(int *)((long)__ptr + (long)iVar3 * 4));
        Gia_ObjSetRepr(p,iVar2,iVar4);
        iVar4 = Gia_ObjRepr(p,iVar2);
        if (iVar4 == 0xfffffff) {
          Gia_ObjSetRepr(p,iVar2,*(int *)((long)__ptr + (long)iVar3 * 4));
        }
        iVar4 = Gia_ObjRepr(p,iVar2);
        if (iVar4 < 1) {
          __assert_fail("Gia_ObjRepr(p, i) > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscClass.c"
                        ,0xf4,"void Ssc_GiaSimProcessRefined(Gia_Man_t *, Vec_Int_t *)");
        }
      }
      *(int *)((long)__ptr + (long)iVar3 * 4) = iVar2;
    }
    for (local_2c = 0; iVar1 = Vec_IntSize(vRefined), local_2c < iVar1; local_2c = local_2c + 1) {
      iVar1 = Vec_IntEntry(vRefined,local_2c);
      iVar2 = Gia_ObjIsHead(p,iVar1);
      if (iVar2 != 0) {
        Ssc_GiaSimClassRefineOne(p,iVar1);
      }
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

void Ssc_GiaSimProcessRefined( Gia_Man_t * p, Vec_Int_t * vRefined )
{
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 100 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        assert( !Ssc_GiaSimIsConst0( p, i ) );
        Key = Ssc_GiaSimHashKey( p, i, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p, i) == 0 );
            assert( Gia_ObjNext(p, i) == 0 );
            Gia_ObjSetRepr( p, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p, pTable[Key], i );
            Gia_ObjSetRepr( p, i, Gia_ObjRepr(p, pTable[Key]) );
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                Gia_ObjSetRepr( p, i, pTable[Key] );
            assert( Gia_ObjRepr(p, i) > 0 );
        }
        pTable[Key] = i;
    }
    Vec_IntForEachEntry( vRefined, i, k )
        if ( Gia_ObjIsHead( p, i ) )
            Ssc_GiaSimClassRefineOne( p, i );
    ABC_FREE( pTable );
}